

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNAnonFunc * CTcPrsOpUnary::parse_anon_func(int short_form,int is_method)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNCodeBody *this;
  tctarg_obj_id_t in_ESI;
  int in_EDI;
  int *in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int in_stack_00000038;
  int in_stack_0000003c;
  CTcParser *in_stack_00000040;
  CTPNCodeBody *code_body;
  int has_retval;
  int err;
  CTcPrsSymtab *lcltab;
  CAnonFuncSymtabPrep symprep;
  tcprs_codebodytype cb_type;
  CTcSymLocal **in_stack_00000088;
  int *in_stack_00000090;
  int *in_stack_00000098;
  CTcPrsSymtab *in_stack_000000a0;
  tcprs_codebodytype in_stack_000000a8;
  CTPNStmTop *pCVar3;
  CTcParser *this_00;
  CTcTokenizer *in_stack_ffffffffffffff78;
  CTPNCodeBody *code_body_00;
  CTPNAnonFunc *this_01;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_38 [8];
  CTcPrsSymtab *local_30;
  undefined4 local_1c;
  tctarg_obj_id_t local_18;
  CTPNStmTop *local_10;
  
  local_18 = in_ESI;
  if (in_EDI == 0) {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2be5ca);
    uVar4 = 1;
    if (tVar1 == TOKT_METHOD) {
      uVar4 = 2;
    }
  }
  else {
    uVar4 = 3;
  }
  local_1c = uVar4;
  CTcTokenizer::next(in_stack_ffffffffffffff78);
  local_30 = CAnonFuncSymtabPrep::create_symtab
                       ((CAnonFuncSymtabPrep *)CONCAT44(in_stack_ffffffffffffffb4,uVar4));
  local_38._4_4_ = 0;
  if (local_18 == 0) {
    CTcParser::is_self_valid(G_prs);
  }
  code_body_00 = (CTPNCodeBody *)local_38;
  this_01 = (CTPNAnonFunc *)(local_38 + 4);
  pCVar3 = (CTPNStmTop *)0x0;
  this_00 = (CTcParser *)0x0;
  this = CTcParser::parse_nested_code_body
                   (in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030,
                    in_stack_00000028,in_stack_00000020,(int *)CONCAT44(short_form,is_method),
                    in_stack_00000088,in_stack_00000090,in_stack_00000098,in_stack_000000a0,
                    in_stack_000000a8);
  if ((this == (CTPNCodeBody *)0x0) || (local_38._4_4_ != 0)) {
    local_10 = (CTPNStmTop *)0x0;
  }
  else {
    if (local_18 == 0) {
      iVar2 = CTPNCodeBodyBase::self_referenced(&this->super_CTPNCodeBodyBase);
      if (iVar2 != 0) {
        CTcParser::set_self_referenced(G_prs,1);
        CTcParser::set_local_ctx_needs_self(G_prs,1);
      }
      iVar2 = CTPNCodeBodyBase::full_method_ctx_referenced(&this->super_CTPNCodeBodyBase);
      if (iVar2 != 0) {
        CTcParser::set_full_method_ctx_referenced(G_prs,1);
        CTcParser::set_local_ctx_needs_full_method_ctx(G_prs,1);
      }
    }
    else {
      CTPNCodeBodyBase::set_anon_method(&this->super_CTPNCodeBodyBase,1);
    }
    CAnonFuncSymtabPrep::finish((CAnonFuncSymtabPrep *)this_01);
    if (((local_18 == 0) && (iVar2 = CTcParser::is_self_valid(G_prs), iVar2 != 0)) &&
       ((iVar2 = CTPNCodeBodyBase::self_referenced(&this->super_CTPNCodeBodyBase), iVar2 != 0 ||
        (iVar2 = CTPNCodeBodyBase::full_method_ctx_referenced(&this->super_CTPNCodeBodyBase),
        iVar2 != 0)))) {
      CTcParser::init_local_ctx(this_00);
    }
    CTcParser::add_nested_stm(this_00,pCVar3);
    pCVar3 = (CTPNStmTop *)CTcPrsAllocObj::operator_new(0x2be7c1);
    CTPNAnonFunc::CTPNAnonFunc(this_01,code_body_00,(int)((ulong)this_00 >> 0x20),(int)this_00);
    local_10 = pCVar3;
  }
  return (CTPNAnonFunc *)local_10;
}

Assistant:

CTPNAnonFunc *CTcPrsOpUnary::parse_anon_func(int short_form, int is_method)
{
    /* 
     *   our code body type can be an anonymous function, a short anonymous
     *   function, or an anonymous method 
     */
    tcprs_codebodytype cb_type =
        (short_form ? TCPRS_CB_SHORT_ANON_FN :
         G_tok->cur() == TOKT_METHOD ? TCPRS_CB_ANON_METHOD :
         TCPRS_CB_ANON_FN);

    /* skip the initial token */
    G_tok->next();

    /* prepare the enclosing local symbol table for the new nested scope */
    CAnonFuncSymtabPrep symprep;
    CTcPrsSymtab *lcltab = symprep.create_symtab();

    /* 
     *   Parse the code body.
     *   
     *   If it's a function (not a method), it shares the method context from
     *   the lexically enclosing scope, so it has access to 'self' and other
     *   method context variables if and only if the enclosing scope does.
     *   If it's a method, it has access to the live method context, so the
     *   enclosing scope's status is irrelevant.  
     */
    int err = 0;
    int has_retval;
    CTPNCodeBody *code_body = G_prs->parse_nested_code_body(
        FALSE, is_method ||  G_prs->is_self_valid(),
        0, 0, 0, 0, 0, &has_retval, &err, lcltab, cb_type);

    /* if that failed, return failure */
    if (code_body == 0 || err != 0)
        return 0;

    /* 
     *   If this is an anonymous function (not an anonymous method), and the
     *   nested code body references 'self' or the full method context, then
     *   so does the enclosing code body, and we need these variables in the
     *   local context for the topmost enclosing code body.
     *   
     *   If this is an anonymous method, references to the method context are
     *   to the live frame at the time of invocation, not to the saved
     *   lexical frame at the time of creation.  So references from within
     *   the method's code body don't create references on the enclosing
     *   scope, and they don't require any shared context information.  
     */
    if (!is_method)
    {
        if (code_body->self_referenced())
        {
            G_prs->set_self_referenced(TRUE);
            G_prs->set_local_ctx_needs_self(TRUE);
        }
        if (code_body->full_method_ctx_referenced())
        {
            G_prs->set_full_method_ctx_referenced(TRUE);
            G_prs->set_local_ctx_needs_full_method_ctx(TRUE);
        }
    }
    else
    {
        /* mark it as a method */
        code_body->set_anon_method(TRUE);
    }

    /* finish the symbol table */
    symprep.finish();

    /* 
     *   if this is a function (not a method), and there's a 'self' object in
     *   the enclosing context, and we referenced 'self' or the full method
     *   context in the nested code body, we'll definitely need a local
     *   context, so make sure we have one initialized even if we don't have
     *   any local variables shared 
     */
    if (!is_method
        && G_prs->is_self_valid()
        && (code_body->self_referenced()
            || code_body->full_method_ctx_referenced()))
    {
        /* initialize a local context here, in the enclosing level */
        G_prs->init_local_ctx();
    }

    /* 
     *   add the code body to the parser's master list of nested top-level
     *   statements for the current program 
     */
    G_prs->add_nested_stm(code_body);

    /* return a new anonymous function node */
    return new CTPNAnonFunc(code_body, has_retval, is_method);
}